

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TagParser::parse(TagParser *this,string *str)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  long *local_50 [2];
  long local_40 [2];
  
  if (str->_M_string_length != 0) {
    uVar3 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar3];
      if ((cVar1 == '[') &&
         (uVar2 = std::__cxx11::string::find((char)str,0x5d), uVar2 != 0xffffffffffffffff)) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)str);
        (*this->_vptr_TagParser[2])(this,local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      else {
        (*this->_vptr_TagParser[3])(this,(ulong)(uint)(int)cVar1);
        uVar2 = uVar3;
      }
      uVar3 = uVar2 + 1;
    } while (uVar3 < str->_M_string_length);
  }
  (*this->_vptr_TagParser[4])(this);
  return;
}

Assistant:

void parse( const std::string& str ) {
            std::size_t pos = 0;
            while( pos < str.size() ) {
                char c = str[pos];
                if( c == '[' ) {
                    std::size_t end = str.find_first_of( ']', pos );
                    if( end != std::string::npos ) {
                        acceptTag( str.substr( pos+1, end-pos-1 ) );
                        pos = end+1;
                    }
                    else {
                        acceptChar( c );
                        pos++;
                    }
                }
                else {
                    acceptChar( c );
                    pos++;
                }
            }
            endParse();
        }